

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O1

econf_err getStringValueNum(econf_file key_file,size_t num,char **result)

{
  char *pcVar1;
  
  if (key_file.file_entry[num].value == (char *)0x0) {
    *result = (char *)0x0;
  }
  else {
    pcVar1 = strdup(key_file.file_entry[num].value);
    *result = pcVar1;
    if (pcVar1 == (char *)0x0) {
      return ECONF_NOMEM;
    }
  }
  return ECONF_SUCCESS;
}

Assistant:

econf_err getStringValueNum(econf_file key_file, size_t num, char **result) {
  if (key_file.file_entry[num].value)
  {
    *result = strdup(key_file.file_entry[num].value);
    if (*result == NULL)
      return ECONF_NOMEM;
  } else {
    *result = NULL;
  }

  return ECONF_SUCCESS;
}